

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPChunk * ChunkRelease(WebPChunk *chunk)

{
  long in_RDI;
  WebPChunk *next;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (WebPChunk *)0x0;
  }
  else {
    if (*(int *)(in_RDI + 4) != 0) {
      WebPDataClear((WebPData *)0x1a5705);
    }
    local_8 = *(WebPChunk **)(in_RDI + 0x18);
    ChunkInit((WebPChunk *)0x1a571c);
  }
  return local_8;
}

Assistant:

WebPChunk* ChunkRelease(WebPChunk* const chunk) {
  WebPChunk* next;
  if (chunk == NULL) return NULL;
  if (chunk->owner_) {
    WebPDataClear(&chunk->data_);
  }
  next = chunk->next_;
  ChunkInit(chunk);
  return next;
}